

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# False.hpp
# Opt level: O1

string * __thiscall
ut11::Operands::FalseOperand::GetErrorMessage<bool>
          (string *__return_storage_ptr__,FalseOperand *this,bool *actual)

{
  stringstream errorMessage;
  char *local_348;
  long local_340;
  char local_338 [16];
  stringstream local_328 [16];
  ostream local_318 [112];
  ios_base local_2a8 [264];
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_328);
  std::__ostream_insert<char,std::char_traits<char>>(local_318,"Expected false but was ",0x17);
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::_M_insert<bool>(SUB81(local_190,0));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  std::__ostream_insert<char,std::char_traits<char>>(local_318,local_348,local_340);
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_328);
  std::ios_base::~ios_base(local_2a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const T& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected false but was " << utility::ToString(actual);
				return errorMessage.str();
			}